

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void av1_subtract_txb(MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,int blk_col,int blk_row,
                     TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  undefined7 in_register_00000089;
  ulong uVar3;
  
  iVar1 = x->plane[plane].src.stride;
  iVar2 = (x->e_mbd).plane[plane].dst.stride;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000089,tx_size) << 2);
  av1_subtract_block((BitDepthInfo)
                     (CONCAT44((uint)((x->e_mbd).cur_buf)->flags >> 3,(x->e_mbd).bd) & 0x1ffffffff),
                     *(int *)((long)tx_size_high + uVar3),*(int *)((long)tx_size_wide + uVar3),
                     x->plane[plane].src_diff +
                     (int)((blk_row * (uint)block_size_wide
                                            [CONCAT71(in_register_00000011,plane_bsize) & 0xffffffff
                                            ] + blk_col) * 4),
                     (ulong)block_size_wide[CONCAT71(in_register_00000011,plane_bsize) & 0xffffffff]
                     ,x->plane[plane].src.buf + (iVar1 * blk_row + blk_col) * 4,(long)iVar1,
                     (x->e_mbd).plane[plane].dst.buf + (iVar2 * blk_row + blk_col) * 4,(long)iVar2);
  return;
}

Assistant:

void av1_subtract_txb(MACROBLOCK *x, int plane, BLOCK_SIZE plane_bsize,
                      int blk_col, int blk_row, TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  struct macroblock_plane *const p = &x->plane[plane];
  const struct macroblockd_plane *const pd = &x->e_mbd.plane[plane];
  const int diff_stride = block_size_wide[plane_bsize];
  const int src_stride = p->src.stride;
  const int dst_stride = pd->dst.stride;
  const int tx1d_width = tx_size_wide[tx_size];
  const int tx1d_height = tx_size_high[tx_size];
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  uint8_t *src = &p->src.buf[(blk_row * src_stride + blk_col) << MI_SIZE_LOG2];
  int16_t *src_diff =
      &p->src_diff[(blk_row * diff_stride + blk_col) << MI_SIZE_LOG2];
  av1_subtract_block(bd_info, tx1d_height, tx1d_width, src_diff, diff_stride,
                     src, src_stride, dst, dst_stride);
}